

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O1

void get_op_access(cs_struct *h,uint id,uint8_t *access,uint64_t *eflags)

{
  uint8_t *puVar1;
  byte bVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  
  puVar1 = X86_get_op_access(h,id,eflags);
  puVar3 = access;
  if (puVar1 == (uint8_t *)0x0) {
LAB_00239c30:
    *puVar3 = '\0';
    return;
  }
  bVar2 = 0;
  do {
    uVar4 = puVar1[bVar2];
    puVar3 = access + bVar2;
    if (uVar4 == 0x80) {
      uVar4 = '\0';
    }
    else if (uVar4 == '\0') goto LAB_00239c30;
    *puVar3 = uVar4;
    bVar2 = bVar2 + 1;
  } while( true );
}

Assistant:

static void get_op_access(cs_struct *h, unsigned int id, uint8_t *access, uint64_t *eflags)
{
	uint8_t count, i;
	uint8_t *arr = X86_get_op_access(h, id, eflags);

	if (!arr) {
		access[0] = 0;
		return;
	}

	// find the non-zero last entry
	for(count = 0; arr[count]; count++);

	if (count == 0)
		return;

	// copy in reverse order this access array from Intel syntax -> AT&T syntax
	count--;
	for(i = 0; i <= count; i++) {
		if (arr[count - i] != CS_AC_IGNORE)
			access[i] = arr[count - i];
		else
			access[i] = 0;
	}
}